

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

void __thiscall
nuraft::inmem_log_store::write_at(inmem_log_store *this,ulong index,ptr<log_entry> *entry)

{
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *this_00;
  _Base_ptr p_Var1;
  iterator __position;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *this_01;
  uint64_t uVar2;
  mapped_type *pmVar3;
  iterator __position_00;
  ptr<log_entry> clone;
  _Base_ptr local_40;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> local_38;
  key_type local_28;
  
  local_40 = (_Base_ptr)index;
  make_clone((ptr<log_entry> *)&local_38);
  std::mutex::lock(&this->logs_lock_);
  this_00 = &this->logs_;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
               ::lower_bound(&this_00->_M_t,(key_type *)&local_40);
  for (; (_Rb_tree_header *)__position._M_node != &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
      __position = std::
                   _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
                                       *)this_00,__position)) {
  }
  this_01 = &std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::operator[](this_00,(key_type *)&local_40)->
             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_38);
  if ((this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i != 0) {
    uVar2 = timer_helper::get_timeofday_us();
    p_Var1 = local_40;
    local_28 = (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i * 1000 + uVar2;
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->disk_emul_logs_being_written_,&local_28);
    *pmVar3 = (mapped_type)p_Var1;
    __position_00._M_node =
         (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)__position_00._M_node !=
           &(this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header) {
      if (local_40 < __position_00._M_node[1]._M_parent) {
        __position_00 =
             std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
             ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                 *)&this->disk_emul_logs_being_written_,__position_00);
      }
      else {
        __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
      }
    }
    EventAwaiter::invoke(&this->disk_emul_ea_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void inmem_log_store::write_at(ulong index, ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    // Discard all logs equal to or greater than `index.
    std::lock_guard<std::mutex> l(logs_lock_);
    auto itr = logs_.lower_bound(index);
    while (itr != logs_.end()) {
        itr = logs_.erase(itr);
    }
    logs_[index] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = index;

        // Remove entries greater than `index`.
        auto entry = disk_emul_logs_being_written_.begin();
        while (entry != disk_emul_logs_being_written_.end()) {
            if (entry->second > index) {
                entry = disk_emul_logs_being_written_.erase(entry);
            } else {
                entry++;
            }
        }
        disk_emul_ea_.invoke();
    }
}